

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

bool __thiscall
brotli::HashLongestMatchQuickly<17,_4,_true>::FindLongestMatch
          (HashLongestMatchQuickly<17,_4,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *s2;
  ushort uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  uint8_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong limit;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_48;
  int local_38;
  
  sVar5 = *best_len_out;
  s2 = ring_buffer + (cur_ix & ring_buffer_mask);
  lVar3 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar9 = lVar3 * 0x1e35a7bd000000;
  local_48 = *best_score_out;
  iVar2 = *distance_cache;
  uVar10 = cur_ix - (long)iVar2;
  uVar8 = s2[sVar5];
  if ((uVar10 < cur_ix) && (uVar8 == (ring_buffer + ((uint)uVar10 & (uint)ring_buffer_mask))[sVar5])
     ) {
    sVar4 = FindMatchLengthWithLimit
                      (ring_buffer + ((uint)uVar10 & (uint)ring_buffer_mask),s2,max_length);
    if (sVar4 < 4) {
      bVar7 = false;
    }
    else {
      auVar13._8_4_ = (int)(sVar4 >> 0x20);
      auVar13._0_8_ = sVar4;
      auVar13._12_4_ = 0x45300000;
      local_48 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 5.4 + 0.6;
      *best_len_out = sVar4;
      *best_len_code_out = sVar4;
      *best_distance_out = (long)iVar2;
      *best_score_out = local_48;
      uVar8 = s2[sVar4];
      bVar7 = true;
      sVar5 = sVar4;
    }
  }
  else {
    bVar7 = false;
  }
  for (lVar11 = 0; (int)lVar11 != 4; lVar11 = lVar11 + 1) {
    uVar6 = this->buckets_[(uVar9 >> 0x2f) + lVar11];
    if ((((uVar8 == (ring_buffer + ((uint)ring_buffer_mask & uVar6))[sVar5]) && (cur_ix != uVar6))
        && (uVar10 = cur_ix - uVar6, uVar10 <= max_backward)) &&
       (sVar4 = FindMatchLengthWithLimit
                          (ring_buffer + ((uint)ring_buffer_mask & uVar6),s2,max_length), 3 < sVar4)
       ) {
      auVar14._8_4_ = (int)(sVar4 >> 0x20);
      auVar14._0_8_ = sVar4;
      auVar14._12_4_ = 0x45300000;
      iVar2 = 0x1f;
      if ((uint)uVar10 != 0) {
        for (; (uint)uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      dVar12 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 5.4 +
               (double)iVar2 * -1.2;
      if (local_48 < dVar12) {
        *best_len_out = sVar4;
        *best_len_code_out = sVar4;
        *best_distance_out = uVar10;
        *best_score_out = dVar12;
        uVar8 = s2[sVar4];
        bVar7 = true;
        sVar5 = sVar4;
        local_48 = dVar12;
      }
    }
  }
  if (bVar7 == false) {
    uVar10 = this->num_dict_matches_;
    if (this->num_dict_lookups_ >> 7 <= uVar10) {
      this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
      local_38 = (int)lVar3;
      uVar1 = *(ushort *)
               (kStaticDictionaryHash + (ulong)((uint)(local_38 * 0x1e35a7bd) >> 0x12) * 4);
      if (uVar1 != 0) {
        limit = (ulong)(uVar1 & 0x1f);
        if (limit <= max_length) {
          sVar5 = FindMatchLengthWithLimit
                            (s2,kBrotliDictionary +
                                ((uVar1 & 0x1f) * (uint)(uVar1 >> 5) +
                                kBrotliDictionaryOffsetsByLength[limit]),limit);
          if ((sVar5 != 0) && (limit < sVar5 + 10)) {
            sVar4 = max_backward + (uVar1 >> 5) +
                    (long)(1 << (""[limit] & 0x1f)) * (ulong)(byte)kCutoffTransforms[limit - sVar5]
                    + 1;
            auVar15._8_4_ = (int)(sVar5 >> 0x20);
            auVar15._0_8_ = sVar5;
            auVar15._12_4_ = 0x45300000;
            iVar2 = 0x1f;
            uVar6 = (uint)sVar4;
            if (uVar6 != 0) {
              for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
              }
            }
            dVar12 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) * 5.4 +
                     (double)iVar2 * -1.2;
            if (local_48 < dVar12) {
              this->num_dict_matches_ = uVar10 + 1;
              *best_len_out = sVar5;
              *best_len_code_out = limit;
              *best_distance_out = sVar4;
              *best_score_out = dVar12;
              bVar7 = true;
            }
          }
        }
      }
    }
  }
  this->buckets_[(uint)(uVar9 >> 0x2f) + ((uint)(cur_ix >> 3) & 3)] = (uint32_t)cur_ix;
  return bVar7;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }